

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QPointF __thiscall QGraphicsViewPrivate::mapToScene(QGraphicsViewPrivate *this,QPointF *point)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  double dVar2;
  QPointF QVar3;
  double local_80;
  QPointF local_68 [5];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = point->xp;
  dVar2 = point->yp;
  qVar1 = horizontalScroll(this);
  local_80 = (double)qVar1 + local_80;
  qVar1 = verticalScroll(this);
  dVar2 = (double)qVar1 + dVar2;
  if ((this->field_0x300 & 0x10) == 0) {
    QTransform::inverted((bool *)local_68);
    local_80 = (double)QTransform::map(local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar3.yp = dVar2;
    QVar3.xp = local_80;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsViewPrivate::mapToScene(const QPointF &point) const
{
    QPointF p = point;
    p.rx() += horizontalScroll();
    p.ry() += verticalScroll();
    return identityMatrix ? p : matrix.inverted().map(p);
}